

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprogressbar.cpp
# Opt level: O0

void __thiscall QProgressBar::setFormat(QProgressBar *this,QString *format)

{
  bool bVar1;
  QProgressBarPrivate *pQVar2;
  QString *in_RSI;
  QString *in_RDI;
  QProgressBarPrivate *d;
  QWidget *in_stack_ffffffffffffffd8;
  
  pQVar2 = d_func((QProgressBar *)0x6637c1);
  bVar1 = ::operator==(in_RDI,(QString *)in_stack_ffffffffffffffd8);
  if (!bVar1) {
    QString::operator=(&pQVar2->format,in_RSI);
    pQVar2->field_0x264 = pQVar2->field_0x264 & 0xfd;
    QWidget::update(in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

void QProgressBar::setFormat(const QString &format)
{
    Q_D(QProgressBar);
    if (d->format == format)
        return;
    d->format = format;
    d->defaultFormat = false;
    update();
}